

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManSetOutputRequireds(Nf_Man_t *p,int fPropCompl)

{
  float fVar1;
  Jf_Par_t *pJVar2;
  Vec_Flt_t *pVVar3;
  Nf_Obj_t *pNVar4;
  ulong uVar5;
  Scl_Con_t *pSVar6;
  int *piVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t __size;
  undefined1 *puVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  
  iVar13 = p->pPars->MapDelay;
  bVar21 = false;
  pSVar6 = Scl_ConReadMan();
  if (pSVar6 != (Scl_Con_t *)0x0) {
    pSVar6 = Scl_ConReadMan();
    iVar14 = (pSVar6->vOutReqs).nSize;
    iVar15 = 0;
    if (0 < (long)iVar14) {
      lVar11 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (uint)((pSVar6->vOutReqs).pArray[lVar11] == 0);
        lVar11 = lVar11 + 1;
      } while (iVar14 != lVar11);
    }
    bVar21 = iVar15 != iVar14;
  }
  iVar14 = p->pGia->nObjs;
  uVar5 = (long)iVar14 * 2;
  iVar15 = (int)uVar5;
  if ((p->vRequired).nCap < iVar15) {
    piVar7 = (p->vRequired).pArray;
    __size = (long)iVar14 << 3;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(piVar7,__size);
    }
    (p->vRequired).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequired).nCap = iVar15;
  }
  if (0 < iVar14) {
    piVar7 = (p->vRequired).pArray;
    uVar12 = 0;
    do {
      piVar7[uVar12] = 0x3fffffff;
      uVar12 = uVar12 + 1;
    } while ((uVar5 & 0xffffffff) != uVar12);
  }
  (p->vRequired).nSize = iVar15;
  pJVar2 = p->pPars;
  pJVar2->MapDelay = 0;
  pGVar8 = p->pGia;
  lVar11 = (long)pGVar8->vCos->nSize;
  if (0 < lVar11) {
    piVar7 = pGVar8->vCos->pArray;
    lVar18 = 0;
    do {
      iVar14 = piVar7[lVar18];
      if (((long)iVar14 < 0) || (pGVar8->nObjs <= iVar14)) goto LAB_00787603;
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
      uVar20 = *(uint *)(pGVar8->pObjs + iVar14);
      iVar14 = *(int *)((long)&p->pNfObjs[(int)(iVar14 - (uVar20 & 0x1fffffff))].M[0][0].D +
                       (ulong)(uVar20 >> 0x18 & 0x20));
      if (iVar14 < pJVar2->MapDelay) {
        iVar14 = pJVar2->MapDelay;
      }
      pJVar2->MapDelay = iVar14;
      lVar18 = lVar18 + 1;
    } while (lVar11 != lVar18);
  }
  if (((p->Iter != 0) && (iVar13 < pJVar2->MapDelay)) && (pGVar8->vOutReqs == (Vec_Flt_t *)0x0)) {
    printf("******** Critical delay violation %.2f -> %.2f ********\n",
           (double)((float)iVar13 / 1000.0),(double)((float)pJVar2->MapDelay / 1000.0));
  }
  pJVar2 = p->pPars;
  if (iVar13 < pJVar2->MapDelay) {
    iVar13 = pJVar2->MapDelay;
  }
  pJVar2->MapDelay = iVar13;
  if (((pJVar2->MapDelayTarget == 0.0) && (!NAN(pJVar2->MapDelayTarget))) &&
     (pJVar2->nRelaxRatio != 0)) {
    pJVar2->MapDelayTarget = (float)(((pJVar2->nRelaxRatio + 100) * iVar13) / 100);
  }
  fVar1 = pJVar2->MapDelayTarget;
  if (0.0 < fVar1) {
    if (fVar1 <= (float)iVar13) {
      if (pJVar2->nRelaxRatio == 0) {
        Abc_Print(0,"Relaxing user-specified delay target from %.2f to %.2f.\n",
                  (double)((float)(int)fVar1 / 1000.0),(double)((float)iVar13 / 1000.0));
      }
    }
    else {
      pJVar2->MapDelay = (int)fVar1;
    }
  }
  pGVar8 = p->pGia;
  pVVar9 = pGVar8->vCos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      uVar20 = pVVar9->pArray[lVar11];
      if (((long)(int)uVar20 < 0) || (pGVar8->nObjs <= (int)uVar20)) {
LAB_00787603:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar19 = *(uint *)(pGVar8->pObjs + (int)uVar20);
      uVar17 = uVar19 & 0x1fffffff;
      iVar13 = uVar20 - uVar17;
      uVar19 = uVar19 >> 0x1d & 1;
      pJVar2 = p->pPars;
      if (pJVar2->fDoAverage == 0) {
        iVar14 = pJVar2->MapDelay;
      }
      else {
        iVar14 = ((pJVar2->nRelaxRatio + 100) *
                 *(int *)((long)&p->pNfObjs[iVar13].M[0][0].D + (ulong)(uVar19 << 5))) / 100;
      }
      if (bVar21) {
        pSVar6 = Scl_ConReadMan();
        if ((pSVar6->vOutReqs).nSize <= lVar11) goto LAB_00787622;
        if (0 < (pSVar6->vOutReqs).pArray[lVar11]) {
          pSVar6 = Scl_ConReadMan();
          if ((pSVar6->vOutReqs).nSize <= lVar11) goto LAB_00787622;
          if (iVar14 <= (pSVar6->vOutReqs).pArray[lVar11]) {
            pSVar6 = Scl_ConReadMan();
            if ((pSVar6->vOutReqs).nSize <= lVar11) goto LAB_00787622;
            iVar14 = (pSVar6->vOutReqs).pArray[lVar11];
          }
        }
      }
      else {
        pVVar3 = pGVar8->vOutReqs;
        if (pVVar3 != (Vec_Flt_t *)0x0) {
          if (pVVar3->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          iVar15 = (int)(pVVar3->pArray[lVar11] * 1000.0);
          if (((0 < iVar15) && (iVar14 <= iVar15)) && (iVar14 = iVar14 * 2, iVar15 <= iVar14)) {
            iVar14 = iVar15;
          }
        }
      }
      if (iVar13 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar10 = uVar19 + iVar13 * 2;
      if ((p->vRequired).nSize <= (int)uVar10) {
LAB_00787622:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = (p->vRequired).pArray;
      if (iVar14 < piVar7[uVar10]) {
        piVar7[uVar10] = iVar14;
      }
      if ((fPropCompl != 0) && (uVar20 != uVar17)) {
        pNVar4 = p->pNfObjs;
        uVar10 = uVar19 << 5;
        uVar20 = *(uint *)(&pNVar4[iVar13].M[0][0].field_0x0 + uVar10);
        uVar17 = *(uint *)(&pNVar4[iVar13].M[0][1].field_0x0 + uVar10);
        if (-1 < (int)(uVar17 ^ uVar20)) {
          __assert_fail("pD->fBest != pA->fBest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
        }
        puVar16 = (undefined1 *)0x0;
        if ((int)uVar20 < 0) {
          puVar16 = &pNVar4[iVar13].M[0][0].field_0x0 + uVar10;
        }
        if ((int)uVar17 < 0) {
          puVar16 = &pNVar4[iVar13].M[0][1].field_0x0 + uVar10;
        }
        if ((puVar16[3] & 0x40) != 0) {
          uVar20 = (uVar19 | iVar13 * 2) ^ 1;
          if ((p->vRequired).nSize <= (int)uVar20) goto LAB_00787622;
          iVar14 = iVar14 - p->InvDelayI;
          if (iVar14 < piVar7[uVar20]) {
            piVar7[uVar20] = iVar14;
          }
        }
      }
      lVar11 = lVar11 + 1;
      pGVar8 = p->pGia;
      pVVar9 = pGVar8->vCos;
    } while (lVar11 < pVVar9->nSize);
  }
  return;
}

Assistant:

void Nf_ManSetOutputRequireds( Nf_Man_t * p, int fPropCompl )
{
    Gia_Obj_t * pObj;
    int Required = 0, MapDelayOld = p->pPars->MapDelay;
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    int i, iObj, fCompl, nLits = 2*Gia_ManObjNum(p->pGia);
    Vec_IntFill( &p->vRequired, nLits, SCL_INFINITY );
    // compute delay
    p->pPars->MapDelay = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Required = Nf_ObjMatchD( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj) )->D;
        p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, Required );
    }
    if ( p->Iter && MapDelayOld < p->pPars->MapDelay && p->pGia->vOutReqs == NULL )
        printf( "******** Critical delay violation %.2f -> %.2f ********\n", Scl_Int2Flt(MapDelayOld), Scl_Int2Flt(p->pPars->MapDelay) ); 
    p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, MapDelayOld );
    // check delay target
    if ( p->pPars->MapDelayTarget == 0 && p->pPars->nRelaxRatio )
        p->pPars->MapDelayTarget = p->pPars->MapDelay * (100 + p->pPars->nRelaxRatio) / 100;
    if ( p->pPars->MapDelayTarget > 0 )
    {
        if ( p->pPars->MapDelay < p->pPars->MapDelayTarget )
            p->pPars->MapDelay = p->pPars->MapDelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %.2f to %.2f.\n", Scl_Int2Flt(p->pPars->MapDelayTarget), Scl_Int2Flt(p->pPars->MapDelay) );
    }
    //assert( p->pPars->MapDelayTarget == 0 );
    // set required times
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj     = Gia_ObjFaninId0p(p->pGia, pObj);
        fCompl   = Gia_ObjFaninC0(pObj);
        Required = Nf_ObjMatchD(p, iObj, fCompl)->D;
        Required = p->pPars->fDoAverage ? Required * (100 + p->pPars->nRelaxRatio) / 100 : p->pPars->MapDelay;
        // if external required time can be achieved, use it
        if ( fUseConMan )
        {
            if ( Scl_ConGetOutReq(i) > 0 && Required <= Scl_ConGetOutReq(i) )
                Required = Scl_ConGetOutReq(i);
        }
        else if ( p->pGia->vOutReqs )
        {
            int NewRequired = Scl_Flt2Int(Vec_FltEntry(p->pGia->vOutReqs, i));
            if ( NewRequired > 0 && Required <= NewRequired )
                Required = Abc_MinInt( 2*Required, NewRequired );
        }
        // if external required cannot be achieved, set the earliest possible arrival time
//        else if ( p->pGia->vOutReqs && Vec_FltEntry(p->pGia->vOutReqs, i) > 0 && Required > Vec_FltEntry(p->pGia->vOutReqs, i) )
//            ptTime->Rise = ptTime->Fall = ptTime->Worst = Required;
        // otherwise, set the global required time
        Nf_ObjUpdateRequired( p, iObj, fCompl, Required );
        if ( fPropCompl && iObj > 0 && Nf_ObjMatchBest(p, iObj, fCompl)->fCompl )
            Nf_ObjUpdateRequired( p, iObj, !fCompl, Required - p->InvDelayI );
        //Nf_ObjMapRefInc( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj));
    }
}